

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<void_*> * __thiscall
kj::_::ExceptionOr<void_*>::operator=(ExceptionOr<void_*> *this,ExceptionOr<void_*> *param_1)

{
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1 = (param_1->value).ptr.field_1;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;